

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O2

int henson_queue_empty(char *name)

{
  NameMap *this;
  bool bVar1;
  uint uVar2;
  allocator local_31;
  string local_30;
  
  this = namemap;
  if (namemap == (NameMap *)0x0) {
    uVar2 = 1;
  }
  else {
    std::__cxx11::string::string((string *)&local_30,name,&local_31);
    bVar1 = henson::NameMap::queue_empty(this,&local_30);
    uVar2 = (uint)bVar1;
    std::__cxx11::string::~string((string *)&local_30);
  }
  return uVar2;
}

Assistant:

int
henson_queue_empty(const char* name)
{
    if (!namemap) return 1;
    return namemap->queue_empty(name);
}